

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secret_storage.cpp
# Opt level: O2

void __thiscall
duckdb::LocalFileSecretStorage::WriteSecret
          (LocalFileSecretStorage *this,BaseSecret *secret,OnCreateConflict on_conflict)

{
  bool bVar1;
  ErrorData *b;
  string *directory;
  _Alloc_hider __rhs;
  hugeint_t hVar2;
  hugeint_t input;
  FileOpenFlags open_flags;
  LocalFileSystem fs;
  string temp_path;
  string file_path;
  string sep;
  string extension_directory_prefix;
  string local_5c0;
  string local_5a0 [2];
  ErrorData error;
  
  fs.super_FileSystem._vptr_FileSystem = (FileSystem)&PTR__FileSystem_027aca08;
  directory = &this->secret_path;
  bVar1 = LocalFileSystem::DirectoryExists
                    (&fs,(string *)directory,(optional_ptr<duckdb::FileOpener,_true>)0x0);
  if (!bVar1) {
    FileSystem::PathSeparator((string *)&sep,&fs.super_FileSystem,(string *)directory);
    StringUtil::Split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                       *)&temp_path,(string *)directory,(string *)&sep);
    extension_directory_prefix._M_dataplus._M_p = (pointer)&extension_directory_prefix.field_2;
    extension_directory_prefix._M_string_length = 0;
    extension_directory_prefix.field_2._M_allocated_capacity =
         extension_directory_prefix.field_2._M_allocated_capacity & 0xffffffffffffff00;
    ::std::__cxx11::string::string((string *)local_5a0,(string *)directory);
    ::std::__cxx11::string::string((string *)&local_5c0,(string *)&sep);
    bVar1 = StringUtil::StartsWith(local_5a0,&local_5c0);
    ::std::__cxx11::string::~string((string *)&local_5c0);
    ::std::__cxx11::string::~string((string *)local_5a0);
    if (bVar1) {
      ::std::__cxx11::string::_M_assign((string *)&extension_directory_prefix);
    }
    for (__rhs._M_p = temp_path._M_dataplus._M_p; __rhs._M_p != (pointer)temp_path._M_string_length;
        __rhs._M_p = __rhs._M_p + 0x20) {
      ::std::operator+(&file_path,&extension_directory_prefix,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       __rhs._M_p);
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&error,
                       &file_path,&sep);
      ::std::__cxx11::string::operator=((string *)&extension_directory_prefix,(string *)&error);
      ::std::__cxx11::string::~string((string *)&error);
      ::std::__cxx11::string::~string((string *)&file_path);
      bVar1 = LocalFileSystem::DirectoryExists
                        (&fs,(string *)&extension_directory_prefix,
                         (optional_ptr<duckdb::FileOpener,_true>)0x0);
      if (!bVar1) {
        LocalFileSystem::CreateDirectory
                  (&fs,(string *)&extension_directory_prefix,
                   (optional_ptr<duckdb::FileOpener,_true>)0x0);
      }
    }
    ::std::__cxx11::string::~string((string *)&extension_directory_prefix);
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&temp_path);
    ::std::__cxx11::string::~string((string *)&sep);
  }
  ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&error,
                   &secret->name,".duckdb_secret");
  b = &error;
  FileSystem::JoinPath((string *)&file_path,&fs.super_FileSystem,(string *)directory,(string *)b);
  ::std::__cxx11::string::~string((string *)&error);
  ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&error,
                   &file_path,".tmp-");
  hVar2 = UUID::GenerateRandomUUID();
  input.lower = hVar2.upper;
  input.upper = (int64_t)b;
  BaseUUID::ToString_abi_cxx11_(&sep,(BaseUUID *)hVar2.lower,input);
  ::std::operator+(&temp_path,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&error,&sep)
  ;
  ::std::__cxx11::string::~string((string *)&sep);
  ::std::__cxx11::string::~string((string *)&error);
  bVar1 = LocalFileSystem::FileExists
                    (&fs,(string *)&file_path,(optional_ptr<duckdb::FileOpener,_true>)0x0);
  if (bVar1) {
    LocalFileSystem::RemoveFile
              (&fs,(string *)&file_path,(optional_ptr<duckdb::FileOpener,_true>)0x0);
  }
  bVar1 = LocalFileSystem::FileExists
                    (&fs,(string *)&temp_path,(optional_ptr<duckdb::FileOpener,_true>)0x0);
  if (bVar1) {
    LocalFileSystem::RemoveFile
              (&fs,(string *)&temp_path,(optional_ptr<duckdb::FileOpener,_true>)0x0);
  }
  open_flags.lock = NO_LOCK;
  open_flags.compression = UNCOMPRESSED;
  open_flags._10_6_ = 0;
  open_flags.flags = 0x52;
  BufferedFileWriter::BufferedFileWriter
            ((BufferedFileWriter *)&sep,&fs.super_FileSystem,&temp_path,open_flags);
  extension_directory_prefix._M_dataplus._M_p = (pointer)0x0;
  extension_directory_prefix._M_string_length = 0;
  extension_directory_prefix.field_2._M_allocated_capacity = 0;
  extension_directory_prefix.field_2._8_8_ = 0;
  SerializationOptions::SerializationOptions((SerializationOptions *)&extension_directory_prefix);
  BinarySerializer::BinarySerializer
            ((BinarySerializer *)&error,(WriteStream *)&sep,
             (SerializationOptions *)&extension_directory_prefix);
  ::std::__cxx11::string::~string((string *)&extension_directory_prefix._M_string_length);
  BinarySerializer::OnObjectBegin((BinarySerializer *)&error);
  (*secret->_vptr_BaseSecret[4])(secret,&error);
  BinarySerializer::OnObjectEnd((BinarySerializer *)&error);
  BufferedFileWriter::Flush((BufferedFileWriter *)&sep);
  BinarySerializer::~BinarySerializer((BinarySerializer *)&error);
  BufferedFileWriter::~BufferedFileWriter((BufferedFileWriter *)&sep);
  LocalFileSystem::MoveFile
            (&fs,(string *)&temp_path,(string *)&file_path,
             (optional_ptr<duckdb::FileOpener,_true>)0x0);
  ::std::__cxx11::string::~string((string *)&temp_path);
  ::std::__cxx11::string::~string((string *)&file_path);
  FileSystem::~FileSystem(&fs.super_FileSystem);
  return;
}

Assistant:

void LocalFileSecretStorage::WriteSecret(const BaseSecret &secret, OnCreateConflict on_conflict) {
	LocalFileSystem fs;

	// We may need to create the secret dir here if the directory was not present during LocalFileSecretStorage
	// construction
	if (!fs.DirectoryExists(secret_path)) {
		// TODO: recursive directory creation should probably live in filesystem
		auto sep = fs.PathSeparator(secret_path);
		auto splits = StringUtil::Split(secret_path, sep);
		D_ASSERT(!splits.empty());
		string extension_directory_prefix;
		if (StringUtil::StartsWith(secret_path, sep)) {
			extension_directory_prefix = sep; // this is swallowed by Split otherwise
		}
		try {
			for (auto &split : splits) {
				extension_directory_prefix = extension_directory_prefix + split + sep;
				if (!fs.DirectoryExists(extension_directory_prefix)) {
					fs.CreateDirectory(extension_directory_prefix);
				}
			}
		} catch (std::exception &ex) {
			ErrorData error(ex);
			if (error.Type() == ExceptionType::IO) {
				throw IOException("Failed to initialize persistent storage directory. (original error: '%s')",
				                  error.RawMessage());
			}
			throw;
		}
	}

	string file_path = fs.JoinPath(secret_path, secret.GetName() + ".duckdb_secret");
	string temp_path = file_path + ".tmp-" + UUID::ToString(UUID::GenerateRandomUUID());

	// If persistent file already exists remove
	if (fs.FileExists(file_path)) {
		fs.RemoveFile(file_path);
	}
	// If temporary file already exists remove
	if (fs.FileExists(temp_path)) {
		fs.RemoveFile(temp_path);
	}

	WriteSecretFileToDisk(fs, temp_path, secret);

	fs.MoveFile(temp_path, file_path);
}